

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLimit::ArchiveIN(ChLinkLimit *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkLimit>(marchive);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_active;
  local_38._name = "m_active";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_penalty_only;
  local_38._name = "m_penalty_only";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_polar;
  local_38._name = "m_polar";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_rotation;
  local_38._name = "m_rotation";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_max;
  local_38._name = "m_max";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_min;
  local_38._name = "m_min";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_maxCushion;
  local_38._name = "m_maxCushion";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_minCushion;
  local_38._name = "m_minCushion";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_Kmax;
  local_38._name = "m_Kmax";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_Kmin;
  local_38._name = "m_Kmin";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_Rmax;
  local_38._name = "m_Rmax";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_Rmin;
  local_38._name = "m_Rmin";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_maxElastic;
  local_38._name = "m_maxElastic";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->m_minElastic;
  local_38._name = "m_minElastic";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = &this->m_Kmax_modul;
  local_38._name = "m_Kmax_modul";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->m_Kmin_modul;
  local_38._name = "m_Kmin_modul";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->m_Rmax_modul;
  local_38._name = "m_Rmax_modul";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->m_Rmin_modul;
  local_38._name = "m_Rmin_modul";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  local_38._value = &this->m_polarMax_funct;
  local_38._name = "m_polarMax_funct";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChLinkLimit::ArchiveIN(ChArchiveIn& marchive) {
    // class version number
    /*int version =*/ marchive.VersionRead<ChLinkLimit>();

    // stream in all member data
    marchive >> CHNVP(m_active);
    marchive >> CHNVP(m_penalty_only);
    marchive >> CHNVP(m_polar);
    marchive >> CHNVP(m_rotation);
    marchive >> CHNVP(m_max);
    marchive >> CHNVP(m_min);
    marchive >> CHNVP(m_maxCushion);
    marchive >> CHNVP(m_minCushion);
    marchive >> CHNVP(m_Kmax);
    marchive >> CHNVP(m_Kmin);
    marchive >> CHNVP(m_Rmax);
    marchive >> CHNVP(m_Rmin);
    marchive >> CHNVP(m_maxElastic);
    marchive >> CHNVP(m_minElastic);
    marchive >> CHNVP(m_Kmax_modul);
    marchive >> CHNVP(m_Kmin_modul);
    marchive >> CHNVP(m_Rmax_modul);
    marchive >> CHNVP(m_Rmin_modul);
    marchive >> CHNVP(m_polarMax_funct);
}